

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

void draw_rectangle(chunk *c,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2,wchar_t feat,wchar_t flag,
                   _Bool overwrite_perm)

{
  _Bool _Var1;
  loc lVar2;
  wchar_t wVar3;
  
  for (wVar3 = y1; wVar3 <= y2; wVar3 = wVar3 + L'\x01') {
    lVar2 = (loc)loc(x1,wVar3);
    if (overwrite_perm) {
      square_set_feat((chunk_conflict *)c,lVar2,feat);
LAB_0014dbe3:
      lVar2 = (loc)loc(x2,wVar3);
      square_set_feat((chunk_conflict *)c,lVar2,feat);
    }
    else {
      _Var1 = square_isperm((chunk_conflict *)c,lVar2);
      if (!_Var1) {
        lVar2 = (loc)loc(x1,wVar3);
        square_set_feat((chunk_conflict *)c,lVar2,feat);
      }
      lVar2 = (loc)loc(x2,wVar3);
      _Var1 = square_isperm((chunk_conflict *)c,lVar2);
      if (!_Var1) goto LAB_0014dbe3;
    }
  }
  wVar3 = x1;
  if (flag != L'\0') {
    generate_mark(c,y1,x1,y2,x1,flag);
    generate_mark(c,y1,x2,y2,x2,flag);
  }
  do {
    if (x2 < wVar3) {
      if (flag == L'\0') {
        return;
      }
      generate_mark(c,y1,x1,y1,x2,flag);
      generate_mark(c,y2,x1,y2,x2,flag);
      return;
    }
    lVar2 = (loc)loc(wVar3,y1);
    if (overwrite_perm) {
      square_set_feat((chunk_conflict *)c,lVar2,feat);
LAB_0014dca3:
      lVar2 = (loc)loc(wVar3,y2);
      square_set_feat((chunk_conflict *)c,lVar2,feat);
    }
    else {
      _Var1 = square_isperm((chunk_conflict *)c,lVar2);
      if (!_Var1) {
        lVar2 = (loc)loc(wVar3,y1);
        square_set_feat((chunk_conflict *)c,lVar2,feat);
      }
      lVar2 = (loc)loc(wVar3,y2);
      _Var1 = square_isperm((chunk_conflict *)c,lVar2);
      if (!_Var1) goto LAB_0014dca3;
    }
    wVar3 = wVar3 + L'\x01';
  } while( true );
}

Assistant:

void draw_rectangle(struct chunk *c, int y1, int x1, int y2, int x2, int feat,
					int flag, bool overwrite_perm)
{
	int y, x;

	for (y = y1; y <= y2; y++) {
		if (overwrite_perm || !square_isperm(c, loc(x1, y))) {
			square_set_feat(c, loc(x1, y), feat);
		}
		if (overwrite_perm || !square_isperm(c, loc(x2, y))) {
			square_set_feat(c, loc(x2, y), feat);
		}
	}
	if (flag) {
		generate_mark(c, y1, x1, y2, x1, flag);
		generate_mark(c, y1, x2, y2, x2, flag);
	}
	for (x = x1; x <= x2; x++) {
		if (overwrite_perm || !square_isperm(c, loc(x, y1))) {
			square_set_feat(c, loc(x, y1), feat);
		}
		if (overwrite_perm || !square_isperm(c, loc(x, y2))) {
			square_set_feat(c, loc(x, y2), feat);
		}
	}
	if (flag) {
		generate_mark(c, y1, x1, y1, x2, flag);
		generate_mark(c, y2, x1, y2, x2, flag);
	}
}